

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::do_resume(torrent *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  time_point32 tVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var5;
  
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) != 0) {
    update_want_tick(this);
    return;
  }
  p_Var5 = (_List_node_base *)&this->m_extensions;
  while (p_Var5 = (((_List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                     *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)&this->m_extensions) {
    cVar1 = (**(code **)(*(long *)p_Var5[1]._M_next + 0x38))();
    if (cVar1 != '\0') {
      return;
    }
  }
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar3) + 0x68) & 0x40) != 0) {
    iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xffffffffffffffd0);
    alert_manager::emplace_alert<libtorrent::torrent_resumed_alert,libtorrent::torrent_handle>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar3),
               (torrent_handle *)&stack0xffffffffffffffd0);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  }
  this->field_0x5e0 = this->field_0x5e0 | 1;
  this->field_0x5c0 = this->field_0x5c0 | 3;
  tVar4 = time_now32();
  (this->m_started).__d.__r = (rep_conflict)tVar4.__d.__r;
  bVar2 = is_seed(this);
  if (bVar2) {
    (this->m_became_seed).__d.__r = (rep_conflict)tVar4.__d.__r;
  }
  bVar2 = is_finished(this);
  if (bVar2) {
    (this->m_became_finished).__d.__r = (this->m_started).__d.__r;
  }
  clear_error(this);
  if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xe00000000000000) ==
       0x200000000000000) && ((this->field_0x600 & 1) != 0)) {
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c])
              ();
  }
  bVar2 = should_check_files(this);
  if (bVar2) {
    start_checking(this);
  }
  state_updated(this);
  update_want_peers(this);
  update_want_tick(this);
  update_want_scrape(this);
  update_gauge(this);
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xe00000000000000) ==
      0x200000000000000) {
    return;
  }
  start_announcing(this);
  do_connect_boost(this);
  return;
}

Assistant:

void torrent::do_resume()
	{
		TORRENT_ASSERT(is_single_thread());
		if (is_paused())
		{
			update_want_tick();
			return;
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			if (ext->on_resume()) return;
		}
#endif

		if (alerts().should_post<torrent_resumed_alert>())
			alerts().emplace_alert<torrent_resumed_alert>(get_handle());

		m_announce_to_dht = true;
		m_announce_to_trackers = true;
		m_announce_to_lsd = true;

		m_started = aux::time_now32();
		if (is_seed()) m_became_seed = m_started;
		if (is_finished()) m_became_finished = m_started;

		clear_error();

		if (m_state == torrent_status::checking_files
			&& m_auto_managed)
		{
			m_ses.trigger_auto_manage();
		}

		if (should_check_files()) start_checking();

		state_updated();
		update_want_peers();
		update_want_tick();
		update_want_scrape();
		update_gauge();

		if (m_state == torrent_status::checking_files) return;

		start_announcing();

		do_connect_boost();
	}